

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write_double<double>(BasicWriter<char> *this,double value,FormatSpec *spec)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Alignment AVar4;
  wchar_t wVar5;
  uint uVar6;
  size_t sVar7;
  BasicWriter<char> *pBVar8;
  CharPtr pcVar9;
  char *__src;
  char *pcVar10;
  FormatSpec *in_RSI;
  BasicWriter<char> *in_RDI;
  double in_XMM0_Qa;
  CharPtr p;
  int result;
  size_t buffer_size;
  char *start;
  uint n;
  char fill;
  uint width_for_sprintf;
  char *format_ptr;
  char format [10];
  uint width;
  size_t offset;
  CharPtr out_1;
  char *inf;
  size_t inf_size;
  CharPtr out;
  char *nan;
  size_t nan_size;
  char sign;
  bool upper;
  char type;
  double in_stack_fffffffffffffee8;
  Buffer<char> *in_stack_fffffffffffffef0;
  Buffer<char> *in_stack_fffffffffffffef8;
  BasicWriter<char> *in_stack_ffffffffffffff00;
  AlignSpec *in_stack_ffffffffffffff18;
  uint total_size;
  undefined4 in_stack_ffffffffffffff20;
  uint uVar11;
  uint in_stack_ffffffffffffff24;
  char *in_stack_ffffffffffffff28;
  BasicWriter<char> *in_stack_ffffffffffffff30;
  char *local_c8;
  char *local_c0;
  char local_b1;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined8 in_stack_ffffffffffffff70;
  char *local_88;
  uint local_7c;
  uint local_74;
  char *local_70;
  undefined1 local_66;
  char local_65 [9];
  uint local_5c;
  size_t local_58;
  char *local_48;
  undefined8 local_40;
  char *local_30;
  undefined8 local_28;
  char local_1b;
  byte local_1a;
  char local_19;
  FormatSpec *local_18;
  double local_10;
  
  cVar2 = (char)((ulong)in_stack_ffffffffffffff70 >> 0x38);
  local_18 = in_RSI;
  local_10 = in_XMM0_Qa;
  local_19 = FormatSpec::type(in_RSI);
  local_1a = 0;
  iVar3 = (int)local_19;
  if (local_19 == '\0') {
    local_19 = 'g';
  }
  else if ((iVar3 == 0x41) || (iVar3 - 0x45U < 3)) {
    local_1a = 1;
  }
  else if ((iVar3 != 0x61) && (2 < iVar3 - 0x65U)) {
    internal::report_unknown_type
              (cVar2,(char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  }
  local_1b = '\0';
  bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isnegative
                    ((double)in_stack_fffffffffffffef8);
  if (bVar1) {
    local_1b = '-';
    local_10 = -local_10;
  }
  else {
    bVar1 = FormatSpec::flag(local_18,1);
    if (bVar1) {
      bVar1 = FormatSpec::flag(local_18,2);
      local_b1 = '+';
      if (!bVar1) {
        local_b1 = ' ';
      }
      local_1b = local_b1;
    }
  }
  bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isnotanumber<double>
                    (in_stack_fffffffffffffee8);
  if (bVar1) {
    local_28 = 4;
    if ((local_1a & 1) == 0) {
      local_c0 = " nan";
    }
    else {
      local_c0 = " NAN";
    }
    local_30 = local_c0;
    if (local_1b == '\0') {
      local_28 = 3;
      local_30 = local_c0 + 1;
    }
    pcVar9 = write_str<char>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                             in_stack_ffffffffffffff18);
    if (local_1b != '\0') {
      *pcVar9 = local_1b;
    }
  }
  else {
    bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isinfinity<double>
                      (in_stack_fffffffffffffee8);
    if (bVar1) {
      local_40 = 4;
      if ((local_1a & 1) == 0) {
        local_c8 = " inf";
      }
      else {
        local_c8 = " INF";
      }
      local_48 = local_c8;
      if (local_1b == '\0') {
        local_40 = 3;
        local_48 = local_c8 + 1;
      }
      pcVar9 = write_str<char>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                               in_stack_ffffffffffffff18);
      if (local_1b != '\0') {
        *pcVar9 = local_1b;
      }
    }
    else {
      local_58 = Buffer<char>::size(in_RDI->buffer_);
      local_5c = WidthSpec::width((WidthSpec *)local_18);
      if (local_1b != '\0') {
        Buffer<char>::size(in_RDI->buffer_);
        in_stack_ffffffffffffff24 = local_5c;
        if (local_5c < 2) {
          in_stack_ffffffffffffff24 = 1;
        }
        Buffer<char>::reserve(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
        if (local_5c != 0) {
          local_5c = local_5c - 1;
        }
        local_58 = local_58 + 1;
      }
      local_70 = local_65;
      local_66 = 0x25;
      local_74 = local_5c;
      bVar1 = FormatSpec::flag(local_18,8);
      if (bVar1) {
        pcVar10 = local_70 + 1;
        *local_70 = '#';
        local_70 = pcVar10;
      }
      AVar4 = AlignSpec::align(&local_18->super_AlignSpec);
      if (AVar4 == ALIGN_CENTER) {
        local_74 = 0;
      }
      else {
        AVar4 = AlignSpec::align(&local_18->super_AlignSpec);
        if (AVar4 == ALIGN_LEFT) {
          *local_70 = '-';
          local_70 = local_70 + 1;
        }
        if (local_5c != 0) {
          *local_70 = '*';
          local_70 = local_70 + 1;
        }
      }
      iVar3 = FormatSpec::precision(local_18);
      if (-1 < iVar3) {
        pcVar10 = local_70 + 1;
        *local_70 = '.';
        local_70 = local_70 + 2;
        *pcVar10 = '*';
      }
      append_float_length<double>(in_RDI,&local_70,local_10);
      *local_70 = local_19;
      local_70[1] = '\0';
      local_70 = local_70 + 1;
      wVar5 = WidthSpec::fill((WidthSpec *)local_18);
      cVar2 = internal::BasicCharTraits<char>::cast(wVar5);
      while( true ) {
        while( true ) {
          sVar7 = Buffer<char>::capacity(in_RDI->buffer_);
          sVar7 = sVar7 - local_58;
          local_88 = Buffer<char>::operator[](in_RDI->buffer_,local_58);
          total_size = (uint)((ulong)&local_66 >> 0x20);
          pcVar10 = local_88;
          uVar11 = local_74;
          FormatSpec::precision(local_18);
          iVar3 = internal::CharTraits<char>::format_float<double>
                            (pcVar10,(size_t)in_stack_ffffffffffffff00,
                             (char *)in_stack_fffffffffffffef8,
                             (uint)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                             (int)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
          wVar5 = (wchar_t)((ulong)pcVar10 >> 0x20);
          if (-1 < iVar3) break;
          in_stack_fffffffffffffef8 = in_RDI->buffer_;
          Buffer<char>::capacity(in_RDI->buffer_);
          Buffer<char>::reserve(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
        }
        local_7c = internal::to_unsigned<int>(iVar3);
        in_stack_ffffffffffffff00 = (BasicWriter<char> *)(local_58 + local_7c);
        pBVar8 = (BasicWriter<char> *)Buffer<char>::capacity(in_RDI->buffer_);
        if (in_stack_ffffffffffffff00 < pBVar8) break;
        Buffer<char>::reserve(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
      }
      if (local_1b != '\0') {
        AVar4 = AlignSpec::align(&local_18->super_AlignSpec);
        if (((AVar4 == ALIGN_RIGHT) ||
            (AVar4 = AlignSpec::align(&local_18->super_AlignSpec), AVar4 == ALIGN_DEFAULT)) &&
           (*local_88 == ' ')) {
          local_88[-1] = cVar2;
        }
        else {
          local_88[-1] = local_1b;
          local_1b = '\0';
        }
        local_7c = local_7c + 1;
      }
      AVar4 = AlignSpec::align(&local_18->super_AlignSpec);
      if ((AVar4 == ALIGN_CENTER) &&
         (uVar6 = WidthSpec::width((WidthSpec *)local_18), local_7c < uVar6)) {
        local_5c = WidthSpec::width((WidthSpec *)local_18);
        pcVar9 = grow_buffer(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
        pcVar10 = get(pcVar9);
        pcVar10 = pcVar10 + (local_5c - local_7c >> 1);
        __src = get(pcVar9);
        memmove(pcVar10,__src,(ulong)local_7c);
        WidthSpec::width((WidthSpec *)local_18);
        fill_padding((CharPtr)CONCAT44(in_stack_ffffffffffffff24,uVar11),total_size,sVar7,wVar5);
      }
      else {
        wVar5 = WidthSpec::fill((WidthSpec *)local_18);
        if ((wVar5 != L' ') || (local_1b != '\0')) {
          while (*local_88 == ' ') {
            *local_88 = cVar2;
            local_88 = local_88 + 1;
          }
          if (local_1b != '\0') {
            local_88[-1] = local_1b;
          }
        }
        grow_buffer(in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
      }
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}